

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetExtensionClassUnqualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  AlphaNum *in_RCX;
  AlphaNum local_a8;
  string local_68;
  AlphaNum local_48;
  csharp *local_18;
  FileDescriptor *descriptor_local;
  
  local_18 = this;
  descriptor_local = (FileDescriptor *)__return_storage_ptr__;
  (anonymous_namespace)::GetFileNameBase_abi_cxx11_
            (&local_68,(_anonymous_namespace_ *)this,descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_48,&local_68);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,"Extensions");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_a8,in_RCX);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtensionClassUnqualifiedName(const FileDescriptor* descriptor) {
  // TODO: Detect collisions with existing messages,
  // and append an underscore if necessary.
  return absl::StrCat(GetFileNameBase(descriptor), "Extensions");
}